

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O3

bool __thiscall
RoboClaw::ReadM2VelocityPID(RoboClaw *this,float *Kp_fp,float *Ki_fp,float *Kd_fp,uint32_t *qpps)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_XMM2 [16];
  uint32_t Kd;
  uint32_t Ki;
  uint32_t Kp;
  
  auVar2 = in_ZMM0._0_16_;
  bVar1 = read_n(this,'\x04','\0','8',&Kp,&Ki,&Kd,qpps);
  auVar2 = vcvtusi2ss_avx512f(auVar2,Kp);
  *Kp_fp = auVar2._0_4_ * 1.5258789e-05;
  auVar2 = vcvtusi2ss_avx512f(in_XMM2,Ki);
  *Ki_fp = auVar2._0_4_ * 1.5258789e-05;
  auVar2 = vcvtusi2ss_avx512f(in_XMM2,Kd);
  *Kd_fp = auVar2._0_4_ * 1.5258789e-05;
  return bVar1;
}

Assistant:

bool RoboClaw::ReadM2VelocityPID( float &Kp_fp,float &Ki_fp,float &Kd_fp,uint32_t &qpps)
{
    uint32_t Kp,Ki,Kd;
    bool valid = read_n(4, m_address, READM2PID,&Kp,&Ki,&Kd,&qpps);
    Kp_fp = ((float)Kp)/65536;
    Ki_fp = ((float)Ki)/65536;
    Kd_fp = ((float)Kd)/65536;
    return valid;
}